

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1be8a27::AV1ConvolveParametersTest_GetCompoundParams_Test::TestBody
          (AV1ConvolveParametersTest_GetCompoundParams_Test *this)

{
  undefined8 *puVar1;
  char *pcVar2;
  SEARCH_METHODS *message;
  char *in_R9;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  v;
  AssertHelper local_70;
  AssertHelper local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined8 *local_58;
  string local_50;
  char *local_30;
  long local_28;
  
  GetCompoundParams();
  local_70.data_._0_4_ = 9;
  pbVar3 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((local_28 - (long)local_30 >> 2) * -0x5555555555555555);
  local_60._M_head_impl = pbVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_50,"9U","v.size()",(uint *)&local_70,(unsigned_long *)&local_60);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(SEARCH_METHODS **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
               ,0x6eb,(char *)message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
    if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_50._M_string_length !=
          (undefined8 *)(local_50._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_50._M_string_length);
      }
      operator_delete((void *)local_50._M_string_length);
    }
    if (local_30 == (char *)0x0) {
      return;
    }
  }
  else {
    if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_50._M_string_length !=
          (undefined8 *)(local_50._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_50._M_string_length);
      }
      operator_delete((void *)local_50._M_string_length);
    }
    local_60._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_60._M_head_impl._1_7_,*local_30) ^ 1);
    local_58 = (undefined8 *)0x0;
    if (*local_30 == '\x01') {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_50,(internal *)&local_60,(AssertionResult *)"v[0].UseDistWtdCompAvg()",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
                 ,0x6ec,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                         (char)local_50._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
LAB_006a2343:
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p));
      }
      if ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 8))();
      }
      puVar1 = local_58;
      if (local_58 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_58 != local_58 + 2) {
          operator_delete((undefined8 *)*local_58);
        }
        operator_delete(puVar1);
      }
    }
    else if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1 < pbVar3
            ) {
      pbVar3 = pbVar3 + -1;
      pcVar2 = local_30;
      do {
        pcVar2 = pcVar2 + 0xc;
        local_60._M_head_impl._0_1_ = *pcVar2;
        local_58 = (undefined8 *)0x0;
        if (*pcVar2 == '\0') {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_50,(internal *)&local_60,(AssertionResult *)"v[i].UseDistWtdCompAvg()",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_test.cc"
                     ,0x6ee,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                             (char)local_50._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
          goto LAB_006a2343;
        }
        pbVar3 = pbVar3 + -1;
      } while (pbVar3 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0);
    }
  }
  operator_delete(local_30);
  return;
}

Assistant:

TEST_F(AV1ConvolveParametersTest, GetCompoundParams) {
  auto v = GetCompoundParams();
  ASSERT_EQ(9U, v.size());
  ASSERT_FALSE(v[0].UseDistWtdCompAvg());
  for (size_t i = 1; i < v.size(); ++i) {
    ASSERT_TRUE(v[i].UseDistWtdCompAvg());
  }
}